

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_suite.cpp
# Opt level: O0

void test_array_null(void)

{
  size_type in_RCX;
  basic_variable<std::allocator<char>_> *pbVar1;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_00;
  basic_variable<std::allocator<char>_> *local_250;
  basic_variable<std::allocator<char>_> *local_238;
  iterator local_228;
  iterator local_210;
  iterator local_1f8;
  iterator local_1e0;
  nullable local_1c4;
  basic_variable<std::allocator<char>_> *local_1c0;
  basic_variable<std::allocator<char>_> local_1b8;
  undefined1 local_188 [24];
  variable expect;
  iterator local_130;
  undefined1 local_118 [8];
  iterator end;
  nullable local_f8 [5];
  nullable local_e4;
  basic_variable<std::allocator<char>_> *local_e0;
  basic_variable<std::allocator<char>_> local_d8;
  basic_variable<std::allocator<char>_> local_a8;
  basic_variable<std::allocator<char>_> local_78;
  undefined1 local_48 [24];
  variable data;
  
  local_e0 = &local_d8;
  local_e4 = null;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_e0,&local_e4);
  local_e0 = &local_a8;
  local_f8[0] = null;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_e0,local_f8);
  local_e0 = &local_78;
  end.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 0;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (local_e0,(nullable *)
                      &end.
                       super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                       .current.field_0xc);
  local_48._0_8_ = &local_d8;
  local_48._8_8_ = 3;
  init._M_len = in_RCX;
  init._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),
             (basic_array<std::allocator<char>_> *)local_48._0_8_,init);
  pbVar1 = &local_d8;
  local_238 = (basic_variable<std::allocator<char>_> *)local_48;
  do {
    local_238 = local_238 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_238);
  } while (local_238 != pbVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_130,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)&expect.storage.field_0x28,
             (basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  std::unique<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
            ((iterator *)local_118,&local_130,(iterator *)&expect.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)&expect.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_130);
  local_1c0 = &local_1b8;
  local_1c4 = null;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_1c0,&local_1c4);
  local_188._0_8_ = &local_1b8;
  local_188._8_8_ = 1;
  init_00._M_len = (size_type)pbVar1;
  init_00._M_array = (iterator)0x1;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_188 + 0x10),
             (basic_array<std::allocator<char>_> *)local_188._0_8_,init_00);
  local_250 = (basic_variable<std::allocator<char>_> *)local_188;
  do {
    local_250 = local_250 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_250);
  } while (local_250 != &local_1b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_1e0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_1f8,(iterator *)local_118);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_210,(basic_variable<std::allocator<char>_> *)(local_188 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_228,(basic_variable<std::allocator<char>_> *)(local_188 + 0x10));
  boost::detail::
  test_all_with_impl<std::ostream,trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator,std::equal_to<trial::dynamic::basic_variable<std::allocator<char>>>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/unique_suite.cpp"
             ,0x54,"void test_array_null()",&local_1e0,&local_1f8,&local_210,&local_228);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_228);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_210);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1e0);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_188 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_118);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  return;
}

Assistant:

void test_array_null()
{
    variable data = array::make({ null, null, null });
    auto end = std::unique(data.begin(), data.end());
    variable expect = array::make({ null });
    TRIAL_PROTOCOL_TEST_ALL_WITH(data.begin(), end,
                                 expect.begin(), expect.end(),
                                 std::equal_to<variable>());
}